

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall Timer::stop(Timer *this)

{
  bool bVar1;
  element_type *this_00;
  undefined1 local_20 [8];
  SharedPtr loop;
  Timer *this_local;
  
  if (this->timerId != 0) {
    loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
    EventLoop::eventLoop();
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_20);
    if (bVar1) {
      this_00 = std::__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_20);
      EventLoop::unregisterTimer(this_00,this->timerId);
    }
    std::shared_ptr<EventLoop>::~shared_ptr((shared_ptr<EventLoop> *)local_20);
    this->timerId = 0;
  }
  return;
}

Assistant:

void Timer::stop()
{
    if (timerId) {
        if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
            loop->unregisterTimer(timerId);
        }
        timerId = 0;
    }
}